

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int imcomp_nulldoubles(double *fdata,long tilelen,int *idata,int nullcheck,double nullflagval,
                      int nullval,int *status)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  lVar3 = 0;
  if (0 < tilelen) {
    lVar3 = tilelen;
  }
  if (nullcheck == 1) {
    for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
      dVar1 = fdata[lVar4];
      if ((dVar1 != nullflagval) || (NAN(dVar1) || NAN(nullflagval))) {
        if (-2147483648.49 <= dVar1) {
          if (dVar1 <= 2147483647.49) {
            dVar2 = 0.5;
            if (dVar1 < 0.0) {
              dVar2 = -0.5;
            }
            idata[lVar4] = (int)(dVar1 + dVar2);
          }
          else {
            *status = -0xb;
            idata[lVar4] = 0x7fffffff;
          }
        }
        else {
          *status = -0xb;
          idata[lVar4] = -0x80000000;
        }
      }
      else {
        idata[lVar4] = nullval;
      }
    }
  }
  else {
    for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
      dVar1 = fdata[lVar4];
      if (-2147483648.49 <= dVar1) {
        if (dVar1 <= 2147483647.49) {
          dVar2 = 0.5;
          if (dVar1 < 0.0) {
            dVar2 = -0.5;
          }
          iVar5 = (int)(dVar1 + dVar2);
        }
        else {
          *status = -0xb;
          iVar5 = 0x7fffffff;
        }
      }
      else {
        *status = -0xb;
        iVar5 = -0x80000000;
      }
      idata[lVar4] = iVar5;
    }
  }
  return *status;
}

Assistant:

int imcomp_nulldoubles(
     double *fdata,
     long tilelen,
     int *idata, 
     int nullcheck,
     double nullflagval,
     int nullval,
     int *status)
/*
   do null value substitution  of the float array.
   If array value = nullflagval, then set the output value to FLOATNULLVALUE.
   Otherwise, inverse scale the integer value.
*/
{
    long ii;
    double dvalue;
    
    if (nullcheck == 1) /* must check for null values */
    {
      for (ii=0; ii < tilelen; ii++)
      {
        if (fdata[ii] == nullflagval)
	    idata[ii] = nullval;
	else 
	{
            dvalue = fdata[ii];

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0.)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
        }
      }
    }
    else  /* don't have to worry about null values */
    {
      for (ii=0; ii < tilelen; ii++)
      {
            dvalue = fdata[ii];

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0.)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
      }
    }
    return(*status);
}